

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O2

void __thiscall glcts::TessellationShaderTCTEgl_in::initTest(TessellationShaderTCTEgl_in *this)

{
  TessellationShaderTCTEgl_in *pTVar1;
  int iVar2;
  deUint32 dVar3;
  GLuint GVar4;
  undefined4 extraout_var;
  MessageBuilder *this_00;
  TestError *this_01;
  NotSupportedError *this_02;
  char **value;
  long lVar6;
  GLint compile_status;
  TessellationShaderTCTEgl_in *local_230;
  GLuint local_228;
  undefined8 local_224;
  GLuint local_21c;
  char *vs_body;
  char *te_body;
  char *tc_body;
  char *fs_body;
  char *src [4];
  string local_1d0;
  GLint link_status;
  ostringstream local_1a8 [376];
  long lVar5;
  
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == false) {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&link_status,"Tessellation shader functionality not supported, skipping",
               (allocator<char> *)src);
    tcu::NotSupportedError::NotSupportedError(this_02,(string *)&link_status);
    __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar5 + 0x708))(1,&this->m_vao_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Could not generate vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x500);
  (**(code **)(lVar5 + 0xd8))(this->m_vao_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x503);
  GVar4 = (**(code **)(lVar5 + 0x3c8))();
  this->m_po_id = GVar4;
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glCreateProgram() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x508);
  GVar4 = (**(code **)(lVar5 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar4;
  GVar4 = (**(code **)(lVar5 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER)
  ;
  this->m_tcs_id = GVar4;
  GVar4 = (**(code **)(lVar5 + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER);
  this->m_tes_id = GVar4;
  GVar4 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar4;
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glCreateShader() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x510);
  fs_body = "${VERSION}\n\nvoid main()\n{\n}\n";
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,this->m_fs_id,1,&fs_body);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glShaderSource() failed for fragment shader object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x51a);
  tc_body = 
  "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = 1) out;\n\nout float out_float[];\nout int   out_int[];\nout ivec3 out_ivec3[];\nout mat2  out_mat2[];\nout uint  out_uint[];\nout uvec2 out_uvec2[];\nout vec4  out_vec4[];\n\nout struct\n{\n    int   test1;\n    float test2;\n} out_struct[];\nvoid main()\n{\n    gl_out           [gl_InvocationID].gl_Position = vec4(5.0, 6.0, 7.0, 8.0);\n    gl_TessLevelOuter[0]                           = 1.0;\n    gl_TessLevelOuter[1]                           = 1.0;\n\n    out_float[gl_InvocationID] = 22.0;\n    out_int  [gl_InvocationID] = 23;\n    out_ivec3[gl_InvocationID] = ivec3(24, 25, 26);\n    out_mat2 [gl_InvocationID] = mat2(vec2(27.0, 28.0), vec2(29.0, 30.0) );\n    out_uint [gl_InvocationID] = 31u;\n    out_uvec2[gl_InvocationID] = uvec2(32, 33);\n    out_vec4 [gl_InvocationID] = vec4(34.0, 35.0, 36.0, 37.0);\n\n    out_struct[gl_InvocationID].test1 = 38;\n    out_struct[gl_InvocationID].test2 = 39.0;\n}\n"
  ;
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,this->m_tcs_id,1,&tc_body);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glShaderSource() failed for tessellation control shader object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x545);
  te_body = 
  "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (isolines, point_mode) in;\n\nin float out_float[];\nin int   out_int[];\nin ivec3 out_ivec3[];\nin mat2  out_mat2[];\nin uint  out_uint[];\nin uvec2 out_uvec2[];\nin vec4  out_vec4[];\nin struct\n{\n    int   test1;\n    float test2;\n} out_struct[];\n\nout float result_float;\nflat out int   result_int;\nflat out ivec3 result_ivec3;\nout mat2  result_mat2;\nflat out int   result_struct_test1;\nout float result_struct_test2;\nflat out uint  result_uint;\nflat out uvec2 result_uvec2;\nout vec4  result_vec4;\n\nvoid main()\n{\n    gl_Position = gl_in[0].gl_Position;\n\n    result_float        = out_float [0];\n    result_int          = out_int   [0];\n    result_ivec3        = out_ivec3 [0];\n    result_mat2         = out_mat2  [0];\n    result_struct_test1 = out_struct[0].test1;\n    result_struct_test2 = out_struct[0].test2;\n    result_uint         = out_uint  [0];\n    result_uvec2        = out_uvec2 [0];\n    result_vec4         = out_vec4  [0];\n}\n"
  ;
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,this->m_tes_id,1,&te_body);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glShaderSource() failed for tessellation evaluation shader object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x575);
  vs_body = 
  "${VERSION}\n\n${SHADER_IO_BLOCKS_ENABLE}\n\nout float out_float;\nflat out int   out_int;\nflat out ivec3 out_ivec3;\nout mat2  out_mat2;\nflat out uint  out_uint;\nflat out uvec2 out_uvec2;\nout vec4  out_vec4;\n\nflat out struct\n{\n    int   test1;\n    float test2;\n} out_struct;\n\nvoid main()\n{\n    gl_Position = vec4(1.0, 2.0, 3.0, 4.0);\n\n    out_float        = 1.0;\n    out_int          = 2;\n    out_ivec3        = ivec3(3, 4, 5);\n    out_mat2         = mat2(vec2(6.0, 7.0), vec2(8.0, 9.0) );\n    out_uint         = 10u;\n    out_uvec2        = uvec2(11u, 12u);\n    out_vec4         = vec4(12.0, 13.0, 14.0, 15.0);\n    out_struct.test1 = 20;\n    out_struct.test2 = 21.0;\n}\n"
  ;
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,this->m_vs_id,1,&vs_body);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glShaderSource() failed for vertex shader object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x59a);
  local_228 = this->m_fs_id;
  local_224._0_4_ = this->m_tcs_id;
  local_224._4_4_ = this->m_tes_id;
  local_21c = this->m_vs_id;
  value = src;
  lVar6 = 0;
  local_230 = this;
  do {
    pTVar1 = local_230;
    if (lVar6 == 4) {
      _link_status = _link_status & 0xffffffff00000000;
      (**(code **)(lVar5 + 0x14c8))(local_230->m_po_id,10,getXFBProperties::xfb_varyings,0x8c8c);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glTransformFeedbackVaryings() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0x5c1);
      (**(code **)(lVar5 + 0x10))(pTVar1->m_po_id,pTVar1->m_fs_id);
      (**(code **)(lVar5 + 0x10))(pTVar1->m_po_id,pTVar1->m_tcs_id);
      (**(code **)(lVar5 + 0x10))(pTVar1->m_po_id,pTVar1->m_tes_id);
      (**(code **)(lVar5 + 0x10))(pTVar1->m_po_id,pTVar1->m_vs_id);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glAttachShader() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0x5c7);
      (**(code **)(lVar5 + 0xce8))(pTVar1->m_po_id);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glLinkProgram() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0x5ca);
      (**(code **)(lVar5 + 0x9d8))(pTVar1->m_po_id,0x8b82,&link_status);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glGetProgramiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0x5cd);
      if (link_status == 1) {
        (**(code **)(lVar5 + 0x6c8))(1,&pTVar1->m_bo_id);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"glGenBuffers() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                        ,0x5d6);
        (**(code **)(lVar5 + 0x40))(0x8c8e,pTVar1->m_bo_id);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"glBindBuffer() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                        ,0x5d9);
        (**(code **)(lVar5 + 0x48))(0x8c8e,0,pTVar1->m_bo_id);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"glBindBufferBase() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                        ,0x5db);
        (**(code **)(lVar5 + 0x150))(0x8c8e,0x160,0,0x88e4);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"glBufferData() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                        ,0x5de);
        return;
      }
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Program linking failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                 ,0x5d1);
LAB_00d1536e:
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    compile_status = 0;
    GVar4 = (&local_228)[lVar6];
    (**(code **)(lVar5 + 0x248))(GVar4);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glCompileShader() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0x5a6);
    (**(code **)(lVar5 + 0xa70))(GVar4,0x8b81,&compile_status);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glGetShaderiv() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0x5a9);
    if (compile_status != 1) {
      src[0] = fs_body;
      src[1] = tc_body;
      src[2] = te_body;
      src[3] = vs_body;
      _link_status = (pointer)((local_230->super_TestCaseBase).super_TestCase.super_TestNode.
                              m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::operator<<((ostream *)local_1a8,"Compilation of shader object at index ");
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::operator<<((ostream *)local_1a8," failed.\n");
      std::operator<<((ostream *)local_1a8,"Info log:\n");
      TestCaseBase::getCompilationInfoLog_abi_cxx11_
                (&local_1d0,&local_230->super_TestCaseBase,GVar4);
      std::operator<<((ostream *)local_1a8,(string *)&local_1d0);
      std::operator<<((ostream *)local_1a8,"Shader:\n");
      this_00 = tcu::MessageBuilder::operator<<((MessageBuilder *)&link_status,value);
      tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Shader compilation failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                 ,0x5b4);
      goto LAB_00d1536e;
    }
    lVar6 = lVar6 + 1;
    value = value + 1;
  } while( true );
}

Assistant:

void TessellationShaderTCTEgl_in::initTest()
{
	/* The test requires EXT_tessellation_shader */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Generate a program object we will later configure */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initialize vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Create program object */
	m_po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() failed");

	/* Generate shader objects the test will use */
	m_fs_id  = gl.createShader(GL_FRAGMENT_SHADER);
	m_tcs_id = gl.createShader(m_glExtTokens.TESS_CONTROL_SHADER);
	m_tes_id = gl.createShader(m_glExtTokens.TESS_EVALUATION_SHADER);
	m_vs_id  = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() failed");

	/* Configure fragment shader */
	const char* fs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "}\n";

	shaderSourceSpecialized(m_fs_id, 1 /* count */, &fs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for fragment shader object");

	/* Configure tessellation control shader */
	const char* tc_body = "${VERSION}\n"
						  "\n"
						  /* Required EXT_tessellation_shader functionality */
						  "${TESSELLATION_SHADER_REQUIRE}\n"
						  "\n"
						  "layout (vertices = 1) out;\n"
						  "\n"
						  "out float out_float[];\n"
						  "out int   out_int[];\n"
						  "out ivec3 out_ivec3[];\n"
						  "out mat2  out_mat2[];\n"
						  "out uint  out_uint[];\n"
						  "out uvec2 out_uvec2[];\n"
						  "out vec4  out_vec4[];\n"
						  "\n"
						  "out struct\n"
						  "{\n"
						  "    int   test1;\n"
						  "    float test2;\n"
						  "} out_struct[];\n"
						  /* Body */
						  "void main()\n"
						  "{\n"
						  "    gl_out           [gl_InvocationID].gl_Position = vec4(5.0, 6.0, 7.0, 8.0);\n"
						  "    gl_TessLevelOuter[0]                           = 1.0;\n"
						  "    gl_TessLevelOuter[1]                           = 1.0;\n"
						  "\n"
						  "    out_float[gl_InvocationID] = 22.0;\n"
						  "    out_int  [gl_InvocationID] = 23;\n"
						  "    out_ivec3[gl_InvocationID] = ivec3(24, 25, 26);\n"
						  "    out_mat2 [gl_InvocationID] = mat2(vec2(27.0, 28.0), vec2(29.0, 30.0) );\n"
						  "    out_uint [gl_InvocationID] = 31u;\n"
						  "    out_uvec2[gl_InvocationID] = uvec2(32, 33);\n"
						  "    out_vec4 [gl_InvocationID] = vec4(34.0, 35.0, 36.0, 37.0);\n"
						  "\n"
						  "    out_struct[gl_InvocationID].test1 = 38;\n"
						  "    out_struct[gl_InvocationID].test2 = 39.0;\n"
						  "}\n";

	shaderSourceSpecialized(m_tcs_id, 1 /* count */, &tc_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for tessellation control shader object");

	/* Configure tessellation evaluation shader */
	const char* te_body = "${VERSION}\n"
						  "\n"
						  "${TESSELLATION_SHADER_REQUIRE}\n"
						  "\n"
						  "layout (isolines, point_mode) in;\n"
						  "\n"
						  "in float out_float[];\n"
						  "in int   out_int[];\n"
						  "in ivec3 out_ivec3[];\n"
						  "in mat2  out_mat2[];\n"
						  "in uint  out_uint[];\n"
						  "in uvec2 out_uvec2[];\n"
						  "in vec4  out_vec4[];\n"
						  "in struct\n"
						  "{\n"
						  "    int   test1;\n"
						  "    float test2;\n"
						  "} out_struct[];\n"
						  "\n"
						  "out float result_float;\n"
						  "flat out int   result_int;\n"
						  "flat out ivec3 result_ivec3;\n"
						  "out mat2  result_mat2;\n"
						  "flat out int   result_struct_test1;\n"
						  "out float result_struct_test2;\n"
						  "flat out uint  result_uint;\n"
						  "flat out uvec2 result_uvec2;\n"
						  "out vec4  result_vec4;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    gl_Position = gl_in[0].gl_Position;\n"
						  "\n"
						  "    result_float        = out_float [0];\n"
						  "    result_int          = out_int   [0];\n"
						  "    result_ivec3        = out_ivec3 [0];\n"
						  "    result_mat2         = out_mat2  [0];\n"
						  "    result_struct_test1 = out_struct[0].test1;\n"
						  "    result_struct_test2 = out_struct[0].test2;\n"
						  "    result_uint         = out_uint  [0];\n"
						  "    result_uvec2        = out_uvec2 [0];\n"
						  "    result_vec4         = out_vec4  [0];\n"
						  "}\n";

	shaderSourceSpecialized(m_tes_id, 1 /* count */, &te_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for tessellation evaluation shader object");

	/* Configure vertex shader */
	const char* vs_body = "${VERSION}\n"
						  "\n"
						  "${SHADER_IO_BLOCKS_ENABLE}\n"
						  "\n"
						  "out float out_float;\n"
						  "flat out int   out_int;\n"
						  "flat out ivec3 out_ivec3;\n"
						  "out mat2  out_mat2;\n"
						  "flat out uint  out_uint;\n"
						  "flat out uvec2 out_uvec2;\n"
						  "out vec4  out_vec4;\n"
						  "\n"
						  "flat out struct\n"
						  "{\n"
						  "    int   test1;\n"
						  "    float test2;\n"
						  "} out_struct;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    gl_Position = vec4(1.0, 2.0, 3.0, 4.0);\n"
						  "\n"
						  "    out_float        = 1.0;\n"
						  "    out_int          = 2;\n"
						  "    out_ivec3        = ivec3(3, 4, 5);\n"
						  "    out_mat2         = mat2(vec2(6.0, 7.0), vec2(8.0, 9.0) );\n"
						  "    out_uint         = 10u;\n"
						  "    out_uvec2        = uvec2(11u, 12u);\n"
						  "    out_vec4         = vec4(12.0, 13.0, 14.0, 15.0);\n"
						  "    out_struct.test1 = 20;\n"
						  "    out_struct.test2 = 21.0;\n"
						  "}\n";

	shaderSourceSpecialized(m_vs_id, 1 /* count */, &vs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for vertex shader object");

	/* Compile all shaders of our interest */
	const glw::GLuint  shaders[] = { m_fs_id, m_tcs_id, m_tes_id, m_vs_id };
	const unsigned int n_shaders = sizeof(shaders) / sizeof(shaders[0]);

	for (unsigned int n_shader = 0; n_shader < n_shaders; ++n_shader)
	{
		glw::GLint  compile_status = GL_FALSE;
		glw::GLuint shader		   = shaders[n_shader];

		gl.compileShader(shader);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed");

		gl.getShaderiv(shader, GL_COMPILE_STATUS, &compile_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed");

		if (compile_status != GL_TRUE)
		{
			const char* src[] = { fs_body, tc_body, te_body, vs_body };
			m_testCtx.getLog() << tcu::TestLog::Message << "Compilation of shader object at index " << n_shader
							   << " failed.\n"
							   << "Info log:\n"
							   << getCompilationInfoLog(shader) << "Shader:\n"
							   << src[n_shader] << tcu::TestLog::EndMessage;

			TCU_FAIL("Shader compilation failed");
		}
	} /* for (all shaders) */

	/* Attach the shaders to the test program object, set up XFB and then link the program */
	glw::GLint			link_status	= GL_FALSE;
	glw::GLint			n_xfb_varyings = 0;
	const glw::GLchar** xfb_varyings   = NULL;
	glw::GLint			xfb_size	   = 0;

	getXFBProperties(&xfb_varyings, &n_xfb_varyings, &xfb_size);

	gl.transformFeedbackVaryings(m_po_id, n_xfb_varyings, xfb_varyings, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed");

	gl.attachShader(m_po_id, m_fs_id);
	gl.attachShader(m_po_id, m_tcs_id);
	gl.attachShader(m_po_id, m_tes_id);
	gl.attachShader(m_po_id, m_vs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed.");

	gl.linkProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

	gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (link_status != GL_TRUE)
	{
		TCU_FAIL("Program linking failed");
	}

	/* Generate and set up a buffer object we will use to hold XFBed data. */
	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed");
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed");

	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_size, NULL /* data */, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed");

	/* We're good to execute the test! */
}